

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O3

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  int iVar1;
  uint uVar2;
  permInfo *pi;
  Abc_TtHieMan_t *p_00;
  char *pcVar3;
  long lVar4;
  word *pTruth;
  char *pcVar5;
  code *func;
  int flag;
  ulong uVar6;
  char pCanonPerm [16];
  timespec ts_1;
  uint pAux [2048];
  word pAuxWord1 [1024];
  char acStack_4068 [24];
  long local_4050;
  timespec local_4048;
  timespec local_4038 [512];
  word local_2038 [1025];
  
  iVar1 = clock_gettime(3,local_4038);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_4038[0].tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_4038[0].tv_sec * -1000000;
  }
  if (NpnType == 0) {
    pcVar5 = "uniqifying          ";
LAB_002e799c:
    if (0x10 < p->nVars) {
LAB_002e80a2:
      __assert_fail("p->nVars <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNpn.c"
                    ,0xd4,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    pcVar3 = "s";
    if (p->nFuncs == 1) {
      pcVar3 = "";
    }
    printf("Applying %-20s to %8d func%s of %2d vars...  ",pcVar5,(ulong)(uint)p->nFuncs,pcVar3);
  }
  else {
    if ((uint)NpnType < 0xc) {
      pcVar5 = &DAT_0098b9ec + *(int *)(&DAT_0098b9e8 + (long)NpnType * 4);
      goto LAB_002e799c;
    }
    if (0x10 < p->nVars) goto LAB_002e80a2;
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  local_4050 = lVar4;
  if (NpnType == 0) {
    iVar1 = p->nFuncs;
    if (0 < iVar1) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          putchar(10);
          iVar1 = p->nFuncs;
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)iVar1);
    }
    goto LAB_002e7ffb;
  }
  switch(NpnType) {
  case 1:
    Abc_TruthNpnCountUnique(p);
    pi = setPermInfoPtr(p->nVars);
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose == 0) {
          simpleMinimal(p->pFuncs[uVar6],(word *)local_4038,local_2038,pi,p->nVars);
        }
        else {
          printf("%7d : ",uVar6 & 0xffffffff);
          simpleMinimal(p->pFuncs[uVar6],(word *)local_4038,local_2038,pi,p->nVars);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,0,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    freePermInfoPtr(pi);
    break;
  case 2:
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        resetPCanonPermArray(acStack_4068,p->nVars);
        uVar2 = Kit_TruthSemiCanonicize
                          ((uint *)p->pFuncs[uVar6],(uint *)local_4038,p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    break;
  case 3:
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        resetPCanonPermArray(acStack_4068,p->nVars);
        uVar2 = luckyCanonicizer_final_fast(p->pFuncs[uVar6],p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    break;
  case 4:
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        resetPCanonPermArray(acStack_4068,p->nVars);
        uVar2 = luckyCanonicizer_final_fast1(p->pFuncs[uVar6],p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    break;
  case 5:
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        uVar2 = Abc_TtCanonicize(p->pFuncs[uVar6],p->nVars,acStack_4068);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    break;
  case 6:
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        uVar2 = Abc_TtCanonicizePhase(p->pFuncs[uVar6],p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint((char *)0x0,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    break;
  case 7:
    p_00 = Abc_TtHieManStart(p->nVars,5);
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose == 0) {
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar6],p->nVars,acStack_4068,0);
        }
        else {
          printf("%7d : ",uVar6 & 0xffffffff);
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar6],p->nVars,acStack_4068,0);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    goto LAB_002e7ff6;
  case 8:
    p_00 = Abc_TtHieManStart(p->nVars,5);
    if (0 < p->nFuncs) {
      uVar6 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        uVar2 = Abc_TtCanonicizeWrap
                          (Abc_TtCanonicizeAda,p_00,p->pFuncs[uVar6],p->nVars,acStack_4068,0x7d);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
    goto LAB_002e7ff6;
  default:
    if (2 < NpnType - 9U) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNpn.c"
                    ,0x167,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    p_00 = Abc_TtHieManStart(p->nVars,5);
    if (0 < p->nFuncs) {
      uVar6 = 0;
      uVar2 = 0;
      do {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        if (NpnType == 0xb) {
          pTruth = p->pFuncs[uVar6];
          iVar1 = p->nVars;
          func = Abc_TtCanonicizeCA;
          flag = 1;
LAB_002e7fa7:
          uVar2 = Abc_TtCanonicizeWrap(func,p_00,pTruth,iVar1,acStack_4068,flag);
        }
        else {
          if (NpnType == 10) {
            pTruth = p->pFuncs[uVar6];
            iVar1 = p->nVars;
            func = Abc_TtCanonicizeAda;
            flag = 0x4af;
            goto LAB_002e7fa7;
          }
          if (NpnType == 9) {
            pTruth = p->pFuncs[uVar6];
            iVar1 = p->nVars;
            func = Abc_TtCanonicizeAda;
            flag = 0x7d;
            goto LAB_002e7fa7;
          }
        }
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(acStack_4068,uVar2,p->nVars);
          putchar(10);
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)p->nFuncs);
    }
LAB_002e7ff6:
    Abc_TtHieManStop(p_00);
  }
LAB_002e7ffb:
  iVar1 = clock_gettime(3,&local_4048);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_4048.tv_nsec / 1000 + local_4048.tv_sec * 1000000;
  }
  lVar4 = lVar4 + local_4050;
  uVar2 = Abc_TruthNpnCountUnique(p);
  iVar1 = 0x98bcc0;
  printf("Classes =%9d  ",(ulong)uVar2);
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  return;
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying          ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN           ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s         ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast  ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good  ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast     ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping  ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching  ";
    else if ( NpnType == 8 )
        pAlgoName = "new adap. matching  ";
    else if ( NpnType == 9 )
        pAlgoName = "adjustable algorithm (heuristic) ";
    else if ( NpnType == 10 )
        pAlgoName = "adjustable algorithm (exact)     ";
    else if ( NpnType == 11 )
        pAlgoName = "new cost-aware exact algorithm   ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        int fExact = 0;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart( p->nVars, 5 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm, fExact );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        // nClasses = Abc_TtManNumClasses( pMan );
		Abc_TtHieManStop( pMan );
    }
    else if ( NpnType == 8 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		int fHigh = 1, iEnumThres = 25;
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, fHigh*100 + iEnumThres);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else if ( NpnType == 9 || NpnType == 10 || NpnType == 11 )
    {
//        typedef unsigned(*TtCanonicizeFunc)(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag);
        unsigned Abc_TtCanonicizeAda(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
        unsigned Abc_TtCanonicizeCA(Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int iThres);
		
		Abc_TtHieMan_t * pMan = Abc_TtHieManStart(p->nVars, 5);
		for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( NpnType == 9 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm,  125); // -A 8, adjustable algorithm (heuristic)
            else if ( NpnType == 10 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda, pMan, p->pFuncs[i], p->nVars, pCanonPerm, 1199); // -A 9, adjustable algorithm (exact)
            else if ( NpnType == 11 )
                uCanonPhase = Abc_TtCanonicizeWrap(Abc_TtCanonicizeCA,  pMan, p->pFuncs[i], p->nVars, pCanonPerm,    1); // -A 10, new cost-aware exact algorithm
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
		Abc_TtHieManStop(pMan);
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", Abc_TruthNpnCountUnique(p) );
    Abc_PrintTime( 1, "Time", clk );
}